

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_tar_v7tar.c
# Opt level: O3

void test_write_format_tar_v7tar(void)

{
  char *pcVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  unkuint9 Var16;
  undefined1 auVar17 [11];
  undefined1 auVar18 [13];
  undefined1 auVar19 [15];
  undefined1 auVar20 [11];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  int iVar25;
  long lVar26;
  undefined4 *buff;
  archive *_a;
  archive_entry *paVar27;
  la_ssize_t lVar28;
  wchar_t wVar29;
  wchar_t wVar30;
  short sVar31;
  byte bVar40;
  byte bVar41;
  byte bVar42;
  byte bVar43;
  byte bVar44;
  byte bVar45;
  byte bVar46;
  byte bVar47;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  char cVar58;
  ushort uVar48;
  char cVar59;
  char cVar62;
  ushort uVar60;
  ushort uVar61;
  char cVar63;
  char cVar66;
  ushort uVar64;
  ushort uVar65;
  char cVar67;
  char cVar70;
  ushort uVar68;
  ushort uVar69;
  ushort uVar71;
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  undefined1 auVar49 [12];
  ushort uVar75;
  ushort uVar76;
  ushort uVar77;
  ushort uVar78;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar57 [16];
  undefined1 auVar79 [16];
  int iVar99;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  long lVar115;
  long lVar117;
  undefined1 auVar116 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [12];
  undefined1 auVar130 [16];
  ushort uVar138;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  ushort uVar139;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  ushort uVar142;
  byte bVar154;
  ushort uVar153;
  undefined1 auVar143 [12];
  ushort uVar148;
  ushort uVar149;
  ushort uVar150;
  ushort uVar151;
  byte bVar152;
  byte bVar155;
  byte bVar157;
  ushort uVar156;
  byte bVar158;
  undefined1 auVar145 [16];
  byte bVar161;
  ushort uVar159;
  ushort uVar160;
  undefined1 auVar147 [16];
  char acStack_117 [7];
  size_t used;
  char f99 [100];
  char acStack_a4 [12];
  char f100 [101];
  undefined4 uVar32;
  undefined6 uVar33;
  undefined8 uVar34;
  undefined1 auVar35 [12];
  undefined1 auVar36 [14];
  undefined1 auVar37 [16];
  undefined1 auVar53 [16];
  undefined1 auVar50 [14];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  long lVar80;
  undefined1 auVar134 [16];
  undefined1 auVar129 [14];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar131 [16];
  undefined1 auVar137 [16];
  undefined1 auVar144 [14];
  undefined1 auVar146 [16];
  
  lVar115 = 0xe;
  lVar117 = 0xf;
  lVar26 = 0xf;
  auVar83 = _DAT_002bb2e0;
  auVar94 = _DAT_002c3280;
  auVar120 = _DAT_002c3290;
  auVar122 = _DAT_002c32a0;
  auVar124 = _DAT_002c32b0;
  auVar126 = _DAT_002c32c0;
  auVar130 = _DAT_00291130;
  auVar140 = _DAT_00291140;
  do {
    auVar81 = auVar140 ^ _DAT_00291150;
    iVar25 = auVar81._0_4_;
    iVar99 = auVar81._8_4_;
    auVar100._4_4_ = iVar25;
    auVar100._0_4_ = iVar25;
    auVar100._8_4_ = iVar99;
    auVar100._12_4_ = iVar99;
    auVar145._0_4_ = -(uint)(iVar25 < -0x7fffff9d);
    auVar145._4_4_ = -(uint)(iVar25 < -0x7fffff9d);
    auVar145._8_4_ = -(uint)(iVar99 < -0x7fffff9d);
    auVar145._12_4_ = -(uint)(iVar99 < -0x7fffff9d);
    auVar82._0_4_ = -(uint)(auVar81._4_4_ == -0x80000000);
    auVar82._4_4_ = -(uint)(auVar81._4_4_ == -0x80000000);
    auVar82._8_4_ = -(uint)(auVar81._12_4_ == -0x80000000);
    auVar82._12_4_ = -(uint)(auVar81._12_4_ == -0x80000000);
    auVar82 = auVar82 & auVar145;
    auVar81 = pshuflw(auVar100,auVar82,0xe8);
    auVar100 = packssdw(auVar81,auVar81);
    bVar46 = auVar83[8];
    bVar47 = auVar83[9];
    bVar152 = auVar83[10];
    bVar154 = auVar83[0xb];
    bVar155 = auVar83[0xc];
    bVar157 = auVar83[0xd];
    bVar158 = auVar83[0xe];
    bVar161 = auVar83[0xf];
    uVar142 = (ushort)((ushort)bVar46 * 0x4f) >> 8;
    uVar148 = (ushort)((ushort)bVar47 * 0x4f) >> 8;
    uVar149 = (ushort)((ushort)bVar152 * 0x4f) >> 8;
    uVar150 = (ushort)((ushort)bVar154 * 0x4f) >> 8;
    uVar151 = (ushort)((ushort)bVar155 * 0x4f) >> 8;
    uVar153 = (ushort)((ushort)bVar157 * 0x4f) >> 8;
    uVar156 = (ushort)((ushort)bVar158 * 0x4f) >> 8;
    uVar159 = (ushort)((ushort)bVar161 * 0x4f) >> 8;
    cVar70 = auVar83[7];
    auVar3[0xd] = 0;
    auVar3._0_13_ = auVar83._0_13_;
    auVar3[0xe] = cVar70;
    cVar67 = auVar83[6];
    auVar5[0xc] = cVar67;
    auVar5._0_12_ = auVar83._0_12_;
    auVar5._13_2_ = auVar3._13_2_;
    auVar7[0xb] = 0;
    auVar7._0_11_ = auVar83._0_11_;
    auVar7._12_3_ = auVar5._12_3_;
    cVar66 = auVar83[5];
    auVar9[10] = cVar66;
    auVar9._0_10_ = auVar83._0_10_;
    auVar9._11_4_ = auVar7._11_4_;
    auVar11[9] = 0;
    auVar11._0_9_ = auVar83._0_9_;
    auVar11._10_5_ = auVar9._10_5_;
    cVar63 = auVar83[4];
    auVar13[8] = cVar63;
    auVar13._0_8_ = auVar83._0_8_;
    auVar13._9_6_ = auVar11._9_6_;
    auVar15._7_8_ = 0;
    auVar15._0_7_ = auVar13._8_7_;
    cVar62 = auVar83[3];
    Var16 = CONCAT81(SUB158(auVar15 << 0x40,7),cVar62);
    auVar21._9_6_ = 0;
    auVar21._0_9_ = Var16;
    cVar59 = auVar83[2];
    auVar17._1_10_ = SUB1510(auVar21 << 0x30,5);
    auVar17[0] = cVar59;
    auVar22._11_4_ = 0;
    auVar22._0_11_ = auVar17;
    cVar58 = auVar83[1];
    auVar18._1_12_ = SUB1512(auVar22 << 0x20,3);
    auVar18[0] = cVar58;
    bVar40 = auVar83[0];
    uVar60 = auVar18._0_2_ * 0x4f;
    uVar64 = auVar17._0_2_ * 0x4f;
    uVar68 = (short)Var16 * 0x4f;
    uVar71 = auVar13._8_2_ * 0x4f;
    uVar73 = auVar9._10_2_ * 0x4f;
    uVar75 = auVar5._12_2_ * 0x4f;
    uVar77 = (auVar3._13_2_ >> 8) * 0x4f;
    uVar48 = (ushort)((ushort)bVar40 * 0x4f) >> 8;
    uVar61 = uVar60 >> 8;
    uVar65 = uVar64 >> 8;
    uVar69 = uVar68 >> 8;
    uVar72 = uVar71 >> 8;
    uVar74 = uVar73 >> 8;
    uVar76 = uVar75 >> 8;
    uVar78 = uVar77 >> 8;
    uVar48 = CONCAT11((uVar61 != 0) * (uVar61 < 0x100) * (char)(uVar60 >> 8) - (0xff < uVar61),
                      (uVar48 != 0) * (uVar48 < 0x100) *
                      (char)((ushort)((ushort)bVar40 * 0x4f) >> 8) - (0xff < uVar48));
    uVar32 = CONCAT13((uVar69 != 0) * (uVar69 < 0x100) * (char)(uVar68 >> 8) - (0xff < uVar69),
                      CONCAT12((uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar64 >> 8) -
                               (0xff < uVar65),uVar48));
    uVar33 = CONCAT15((uVar74 != 0) * (uVar74 < 0x100) * (char)(uVar73 >> 8) - (0xff < uVar74),
                      CONCAT14((uVar72 != 0) * (uVar72 < 0x100) * (char)(uVar71 >> 8) -
                               (0xff < uVar72),uVar32));
    uVar34 = CONCAT17((uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78),
                      CONCAT16((uVar76 != 0) * (uVar76 < 0x100) * (char)(uVar75 >> 8) -
                               (0xff < uVar76),uVar33));
    auVar49._0_10_ =
         CONCAT19((uVar148 != 0) * (uVar148 < 0x100) * (char)((ushort)((ushort)bVar47 * 0x4f) >> 8)
                  - (0xff < uVar148),
                  CONCAT18((uVar142 != 0) * (uVar142 < 0x100) *
                           (char)((ushort)((ushort)bVar46 * 0x4f) >> 8) - (0xff < uVar142),uVar34));
    auVar49[10] = (uVar149 != 0) * (uVar149 < 0x100) * (char)((ushort)((ushort)bVar152 * 0x4f) >> 8)
                  - (0xff < uVar149);
    auVar49[0xb] = (uVar150 != 0) * (uVar150 < 0x100) *
                   (char)((ushort)((ushort)bVar154 * 0x4f) >> 8) - (0xff < uVar150);
    auVar50[0xc] = (uVar151 != 0) * (uVar151 < 0x100) *
                   (char)((ushort)((ushort)bVar155 * 0x4f) >> 8) - (0xff < uVar151);
    auVar50._0_12_ = auVar49;
    auVar50[0xd] = (uVar153 != 0) * (uVar153 < 0x100) *
                   (char)((ushort)((ushort)bVar157 * 0x4f) >> 8) - (0xff < uVar153);
    auVar81[0xe] = (uVar156 != 0) * (uVar156 < 0x100) *
                   (char)((ushort)((ushort)bVar158 * 0x4f) >> 8) - (0xff < uVar156);
    auVar81._0_14_ = auVar50;
    auVar81[0xf] = (uVar159 != 0) * (uVar159 < 0x100) *
                   (char)((ushort)((ushort)bVar161 * 0x4f) >> 8) - (0xff < uVar159);
    auVar51._0_2_ = uVar48 >> 3;
    auVar51._2_2_ = (ushort)((uint)uVar32 >> 0x13);
    auVar51._4_2_ = (ushort)((uint6)uVar33 >> 0x23);
    auVar51._6_2_ = (ushort)((ulong)uVar34 >> 0x33);
    auVar51._8_2_ = (ushort)((unkuint10)auVar49._0_10_ >> 0x43);
    auVar51._10_2_ = auVar49._10_2_ >> 3;
    auVar51._12_2_ = auVar50._12_2_ >> 3;
    auVar51._14_2_ = auVar81._14_2_ >> 3;
    auVar51 = auVar51 & _DAT_002c53e0;
    sVar31 = CONCAT11(auVar51[8],auVar51[8]);
    uVar32 = CONCAT13(auVar51[9],CONCAT12(auVar51[9],sVar31));
    uVar33 = CONCAT15(auVar51[10],CONCAT14(auVar51[10],uVar32));
    uVar34 = CONCAT17(auVar51[0xb],CONCAT16(auVar51[0xb],uVar33));
    auVar143._0_10_ = CONCAT19(auVar51[0xc],CONCAT18(auVar51[0xc],uVar34));
    auVar143[10] = auVar51[0xd];
    auVar143[0xb] = auVar51[0xd];
    auVar144[0xc] = auVar51[0xe];
    auVar144._0_12_ = auVar143;
    auVar144[0xd] = auVar51[0xe];
    auVar146[0xf] = auVar51[0xf];
    auVar146[0xe] = auVar146[0xf];
    auVar146._0_14_ = auVar144;
    uVar74 = sVar31 * 0x1a;
    uVar76 = (short)((uint)uVar32 >> 0x10) * 0x1a;
    uVar78 = (short)((uint6)uVar33 >> 0x20) * 0x1a;
    uVar148 = (short)((ulong)uVar34 >> 0x30) * 0x1a;
    uVar150 = (short)((unkuint10)auVar143._0_10_ >> 0x40) * 0x1a;
    uVar153 = auVar143._10_2_ * 0x1a;
    uVar159 = auVar144._12_2_ * 0x1a;
    uVar160 = auVar146._14_2_ * 0x1a;
    uVar75 = uVar74 & 0xff;
    uVar77 = uVar76 & 0xff;
    uVar142 = uVar78 & 0xff;
    uVar149 = uVar148 & 0xff;
    uVar151 = uVar150 & 0xff;
    uVar156 = uVar153 & 0xff;
    uVar138 = uVar159 & 0xff;
    uVar139 = uVar160 & 0xff;
    auVar56._0_14_ = auVar51._0_14_;
    auVar56[0xe] = auVar51[7];
    auVar56[0xf] = auVar51[7];
    auVar55._14_2_ = auVar56._14_2_;
    auVar55._0_13_ = auVar51._0_13_;
    auVar55[0xd] = auVar51[6];
    auVar54._13_3_ = auVar55._13_3_;
    auVar54._0_12_ = auVar51._0_12_;
    auVar54[0xc] = auVar51[6];
    auVar53._12_4_ = auVar54._12_4_;
    auVar53._0_11_ = auVar51._0_11_;
    auVar53[0xb] = auVar51[5];
    auVar52._11_5_ = auVar53._11_5_;
    auVar52._0_10_ = auVar51._0_10_;
    auVar52[10] = auVar51[5];
    bVar41 = auVar51[0] * '\x1a';
    bVar42 = auVar51[1] * '\x1a';
    bVar43 = auVar51[2] * '\x1a';
    bVar44 = auVar51[3] * '\x1a';
    bVar45 = auVar51[4] * '\x1a';
    uVar68 = auVar52._10_2_ * 0x1a;
    uVar71 = auVar54._12_2_ * 0x1a;
    uVar48 = (ushort)bVar41;
    uVar60 = (ushort)bVar42;
    uVar61 = (ushort)bVar43;
    uVar64 = (ushort)bVar44;
    uVar65 = (ushort)bVar45;
    uVar69 = uVar68 & 0xff;
    uVar72 = uVar71 & 0xff;
    uVar73 = auVar55._14_2_ * 0x1a & 0xff;
    if ((auVar100 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      acStack_117[lVar26] =
           (bVar40 - ((uVar48 != 0) * (uVar48 < 0x100) * bVar41 - (0xff < uVar48))) + 'a';
    }
    auVar83 = packssdw(auVar82,auVar82);
    auVar83 = packssdw(auVar83,auVar83);
    auVar83 = packsswb(auVar83,auVar83);
    if ((auVar83._0_4_ >> 8 & 1) != 0) {
      acStack_117[lVar26 + 1] =
           (cVar58 - ((uVar60 != 0) * (uVar60 < 0x100) * bVar42 - (0xff < uVar60))) + 'a';
    }
    auVar83 = auVar130 ^ _DAT_00291150;
    auVar101._0_4_ = -(uint)(auVar83._0_4_ < -0x7fffff9d);
    auVar101._4_4_ = -(uint)(auVar83._0_4_ < -0x7fffff9d);
    auVar101._8_4_ = -(uint)(auVar83._8_4_ < -0x7fffff9d);
    auVar101._12_4_ = -(uint)(auVar83._8_4_ < -0x7fffff9d);
    auVar84._0_4_ = -(uint)(auVar83._4_4_ == -0x80000000);
    auVar84._4_4_ = -(uint)(auVar83._4_4_ == -0x80000000);
    auVar84._8_4_ = -(uint)(auVar83._12_4_ == -0x80000000);
    auVar84._12_4_ = -(uint)(auVar83._12_4_ == -0x80000000);
    auVar83 = packssdw(auVar83,auVar84 & auVar101);
    auVar83 = packssdw(auVar83,auVar83);
    auVar83 = packsswb(auVar83,auVar83);
    auVar57._8_8_ = lVar117;
    auVar57._0_8_ = lVar115;
    if ((auVar83._0_4_ >> 0x10 & 1) != 0) {
      acStack_117[lVar26 + 2] =
           (cVar59 - ((uVar61 != 0) * (uVar61 < 0x100) * bVar43 - (0xff < uVar61))) + 'a';
    }
    auVar83 = pshufhw(auVar83,auVar84 & auVar101,0x84);
    auVar83 = packssdw(auVar83,auVar83);
    auVar83 = packsswb(auVar83,auVar83);
    if ((auVar83._0_4_ >> 0x18 & 1) != 0) {
      acStack_117[lVar26 + 3] =
           (cVar62 - ((uVar64 != 0) * (uVar64 < 0x100) * bVar44 - (0xff < uVar64))) + 'a';
    }
    auVar83 = auVar126 ^ _DAT_00291150;
    auVar102._0_4_ = -(uint)(auVar83._0_4_ < -0x7fffff9d);
    auVar102._4_4_ = -(uint)(auVar83._0_4_ < -0x7fffff9d);
    auVar102._8_4_ = -(uint)(auVar83._8_4_ < -0x7fffff9d);
    auVar102._12_4_ = -(uint)(auVar83._8_4_ < -0x7fffff9d);
    auVar85._0_4_ = -(uint)(auVar83._4_4_ == -0x80000000);
    auVar85._4_4_ = -(uint)(auVar83._4_4_ == -0x80000000);
    auVar85._8_4_ = -(uint)(auVar83._12_4_ == -0x80000000);
    auVar85._12_4_ = -(uint)(auVar83._12_4_ == -0x80000000);
    auVar85 = auVar85 & auVar102;
    auVar83 = pshuflw(auVar83,auVar85,0xe8);
    auVar83 = packssdw(auVar83,auVar83);
    auVar83 = packsswb(auVar83,auVar83);
    if ((auVar83 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      acStack_117[lVar26 + 4] =
           (cVar63 - ((uVar65 != 0) * (uVar65 < 0x100) * bVar45 - (0xff < uVar65))) + 'a';
    }
    auVar81 = packssdw(auVar85,auVar85);
    auVar83 = packssdw(auVar83,auVar81);
    auVar83 = packsswb(auVar83,auVar83);
    if ((auVar83._4_2_ >> 8 & 1) != 0) {
      acStack_117[lVar26 + 5] =
           (cVar66 - ((uVar69 != 0) * (uVar69 < 0x100) * (char)uVar68 - (0xff < uVar69))) + 'a';
    }
    auVar83 = auVar124 ^ _DAT_00291150;
    auVar103._0_4_ = -(uint)(auVar83._0_4_ < -0x7fffff9d);
    auVar103._4_4_ = -(uint)(auVar83._0_4_ < -0x7fffff9d);
    auVar103._8_4_ = -(uint)(auVar83._8_4_ < -0x7fffff9d);
    auVar103._12_4_ = -(uint)(auVar83._8_4_ < -0x7fffff9d);
    auVar86._0_4_ = -(uint)(auVar83._4_4_ == -0x80000000);
    auVar86._4_4_ = -(uint)(auVar83._4_4_ == -0x80000000);
    auVar86._8_4_ = -(uint)(auVar83._12_4_ == -0x80000000);
    auVar86._12_4_ = -(uint)(auVar83._12_4_ == -0x80000000);
    auVar83 = packssdw(auVar83,auVar86 & auVar103);
    auVar83 = packssdw(auVar83,auVar83);
    auVar83 = packsswb(auVar83,auVar83);
    if ((auVar83 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      acStack_117[lVar26 + 6] =
           (cVar67 - ((uVar72 != 0) * (uVar72 < 0x100) * (char)uVar71 - (0xff < uVar72))) + 'a';
    }
    auVar83 = pshufhw(auVar83,auVar86 & auVar103,0x84);
    auVar83 = packssdw(auVar83,auVar83);
    auVar83 = packsswb(auVar83,auVar83);
    if ((auVar83._6_2_ >> 8 & 1) != 0) {
      f99[lVar26 + -8] =
           (cVar70 - ((uVar73 != 0) * (uVar73 < 0x100) * (char)(auVar55._14_2_ * 0x1a) -
                     (0xff < uVar73))) + 'a';
    }
    auVar83 = auVar122 ^ _DAT_00291150;
    auVar104._0_4_ = -(uint)(auVar83._0_4_ < -0x7fffff9d);
    auVar104._4_4_ = -(uint)(auVar83._0_4_ < -0x7fffff9d);
    auVar104._8_4_ = -(uint)(auVar83._8_4_ < -0x7fffff9d);
    auVar104._12_4_ = -(uint)(auVar83._8_4_ < -0x7fffff9d);
    auVar87._0_4_ = -(uint)(auVar83._4_4_ == -0x80000000);
    auVar87._4_4_ = -(uint)(auVar83._4_4_ == -0x80000000);
    auVar87._8_4_ = -(uint)(auVar83._12_4_ == -0x80000000);
    auVar87._12_4_ = -(uint)(auVar83._12_4_ == -0x80000000);
    auVar87 = auVar87 & auVar104;
    auVar83 = pshuflw(auVar83,auVar87,0xe8);
    auVar83 = packssdw(auVar83,auVar83);
    auVar83 = packsswb(auVar83,auVar83);
    if ((auVar83 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      f99[lVar26 + -7] =
           (bVar46 - ((uVar75 != 0) * (uVar75 < 0x100) * (char)uVar74 - (0xff < uVar75))) + 'a';
    }
    auVar81 = packssdw(auVar87,auVar87);
    auVar81 = packssdw(auVar81,auVar81);
    auVar83 = packsswb(auVar83,auVar81);
    if ((auVar83._8_2_ >> 8 & 1) != 0) {
      f99[lVar26 + -6] =
           (bVar47 - ((uVar77 != 0) * (uVar77 < 0x100) * (char)uVar76 - (0xff < uVar77))) + 'a';
    }
    auVar83 = auVar120 ^ _DAT_00291150;
    auVar105._0_4_ = -(uint)(auVar83._0_4_ < -0x7fffff9d);
    auVar105._4_4_ = -(uint)(auVar83._0_4_ < -0x7fffff9d);
    auVar105._8_4_ = -(uint)(auVar83._8_4_ < -0x7fffff9d);
    auVar105._12_4_ = -(uint)(auVar83._8_4_ < -0x7fffff9d);
    auVar88._0_4_ = -(uint)(auVar83._4_4_ == -0x80000000);
    auVar88._4_4_ = -(uint)(auVar83._4_4_ == -0x80000000);
    auVar88._8_4_ = -(uint)(auVar83._12_4_ == -0x80000000);
    auVar88._12_4_ = -(uint)(auVar83._12_4_ == -0x80000000);
    auVar83 = packssdw(auVar83,auVar88 & auVar105);
    auVar83 = packssdw(auVar83,auVar83);
    auVar83 = packsswb(auVar83,auVar83);
    if ((auVar83 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      f99[lVar26 + -5] =
           (bVar152 - ((uVar142 != 0) * (uVar142 < 0x100) * (char)uVar78 - (0xff < uVar142))) + 'a';
    }
    auVar83 = pshufhw(auVar83,auVar88 & auVar105,0x84);
    auVar83 = packssdw(auVar83,auVar83);
    auVar83 = packsswb(auVar83,auVar83);
    if ((auVar83._10_2_ >> 8 & 1) != 0) {
      f99[lVar26 + -4] =
           (bVar154 - ((uVar149 != 0) * (uVar149 < 0x100) * (char)uVar148 - (0xff < uVar149))) + 'a'
      ;
    }
    auVar83 = auVar94 ^ _DAT_00291150;
    auVar106._0_4_ = -(uint)(auVar83._0_4_ < -0x7fffff9d);
    auVar106._4_4_ = -(uint)(auVar83._0_4_ < -0x7fffff9d);
    auVar106._8_4_ = -(uint)(auVar83._8_4_ < -0x7fffff9d);
    auVar106._12_4_ = -(uint)(auVar83._8_4_ < -0x7fffff9d);
    auVar89._0_4_ = -(uint)(auVar83._4_4_ == -0x80000000);
    auVar89._4_4_ = -(uint)(auVar83._4_4_ == -0x80000000);
    auVar89._8_4_ = -(uint)(auVar83._12_4_ == -0x80000000);
    auVar89._12_4_ = -(uint)(auVar83._12_4_ == -0x80000000);
    auVar89 = auVar89 & auVar106;
    auVar83 = pshuflw(auVar83,auVar89,0xe8);
    auVar83 = packssdw(auVar83,auVar83);
    auVar83 = packsswb(auVar83,auVar83);
    if ((auVar83 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      f99[lVar26 + -3] =
           (bVar155 - ((uVar151 != 0) * (uVar151 < 0x100) * (char)uVar150 - (0xff < uVar151))) + 'a'
      ;
    }
    auVar81 = packssdw(auVar89,auVar89);
    auVar83 = packssdw(auVar83,auVar81);
    auVar83 = packsswb(auVar83,auVar83);
    if ((auVar83._12_2_ >> 8 & 1) != 0) {
      f99[lVar26 + -2] =
           (bVar157 - ((uVar156 != 0) * (uVar156 < 0x100) * (char)uVar153 - (0xff < uVar156))) + 'a'
      ;
    }
    auVar57 = auVar57 ^ _DAT_00291150;
    auVar107._0_4_ = -(uint)(auVar57._0_4_ < -0x7fffff9d);
    auVar107._4_4_ = -(uint)(auVar57._0_4_ < -0x7fffff9d);
    auVar107._8_4_ = -(uint)(auVar57._8_4_ < -0x7fffff9d);
    auVar107._12_4_ = -(uint)(auVar57._8_4_ < -0x7fffff9d);
    auVar90._0_4_ = -(uint)(auVar57._4_4_ == -0x80000000);
    auVar90._4_4_ = -(uint)(auVar57._4_4_ == -0x80000000);
    auVar90._8_4_ = -(uint)(auVar57._12_4_ == -0x80000000);
    auVar90._12_4_ = -(uint)(auVar57._12_4_ == -0x80000000);
    auVar83 = packssdw(auVar57,auVar90 & auVar107);
    auVar83 = packssdw(auVar83,auVar83);
    auVar83 = packsswb(auVar83,auVar83);
    if ((auVar83 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      f99[lVar26 + -1] =
           (bVar158 - ((uVar138 != 0) * (uVar138 < 0x100) * (char)uVar159 - (0xff < uVar138))) + 'a'
      ;
    }
    auVar83 = pshufhw(auVar83,auVar90 & auVar107,0x84);
    auVar83 = packssdw(auVar83,auVar83);
    auVar83 = packsswb(auVar83,auVar83);
    if ((auVar83._14_2_ >> 8 & 1) != 0) {
      f99[lVar26] = (bVar161 -
                    ((uVar139 != 0) * (uVar139 < 0x100) * (char)uVar160 - (0xff < uVar139))) + 'a';
    }
    lVar80 = auVar140._8_8_;
    auVar140._0_8_ = auVar140._0_8_ + 0x10;
    auVar140._8_8_ = lVar80 + 0x10;
    lVar80 = auVar130._8_8_;
    auVar130._0_8_ = auVar130._0_8_ + 0x10;
    auVar130._8_8_ = lVar80 + 0x10;
    lVar80 = auVar126._8_8_;
    auVar126._0_8_ = auVar126._0_8_ + 0x10;
    auVar126._8_8_ = lVar80 + 0x10;
    lVar80 = auVar124._8_8_;
    auVar124._0_8_ = auVar124._0_8_ + 0x10;
    auVar124._8_8_ = lVar80 + 0x10;
    lVar80 = auVar122._8_8_;
    auVar122._0_8_ = auVar122._0_8_ + 0x10;
    auVar122._8_8_ = lVar80 + 0x10;
    lVar80 = auVar120._8_8_;
    auVar120._0_8_ = auVar120._0_8_ + 0x10;
    auVar120._8_8_ = lVar80 + 0x10;
    lVar80 = auVar94._8_8_;
    auVar94._0_8_ = auVar94._0_8_ + 0x10;
    auVar94._8_8_ = lVar80 + 0x10;
    lVar115 = lVar115 + 0x10;
    lVar117 = lVar117 + 0x10;
    auVar83[0] = bVar40 + 0x10;
    auVar83[1] = cVar58 + '\x10';
    auVar83[2] = cVar59 + '\x10';
    auVar83[3] = cVar62 + '\x10';
    auVar83[4] = cVar63 + '\x10';
    auVar83[5] = cVar66 + '\x10';
    auVar83[6] = cVar67 + '\x10';
    auVar83[7] = cVar70 + '\x10';
    auVar83[8] = bVar46 + 0x10;
    auVar83[9] = bVar47 + 0x10;
    auVar83[10] = bVar152 + 0x10;
    auVar83[0xb] = bVar154 + 0x10;
    auVar83[0xc] = bVar155 + 0x10;
    auVar83[0xd] = bVar157 + 0x10;
    auVar83[0xe] = bVar158 + 0x10;
    auVar83[0xf] = bVar161 + 0x10;
    lVar26 = lVar26 + 0x10;
  } while (lVar26 != 0x7f);
  f99[99] = '\0';
  lVar115 = 0xe;
  lVar117 = 0xf;
  lVar26 = 0xf;
  auVar79 = _DAT_002c32b0;
  auVar116 = _DAT_002bb2e0;
  auVar118 = _DAT_00291130;
  auVar119 = _DAT_002c3280;
  auVar121 = _DAT_002c3290;
  auVar123 = _DAT_002c32a0;
  auVar125 = _DAT_002c32c0;
  auVar127 = _DAT_00291140;
  do {
    auVar83 = auVar127 ^ _DAT_00291150;
    auVar108._0_4_ = -(uint)(auVar83._0_4_ < -0x7fffff9c);
    auVar108._4_4_ = -(uint)(auVar83._0_4_ < -0x7fffff9c);
    auVar108._8_4_ = -(uint)(auVar83._8_4_ < -0x7fffff9c);
    auVar108._12_4_ = -(uint)(auVar83._8_4_ < -0x7fffff9c);
    auVar91._0_4_ = -(uint)(auVar83._4_4_ == -0x80000000);
    auVar91._4_4_ = -(uint)(auVar83._4_4_ == -0x80000000);
    auVar91._8_4_ = -(uint)(auVar83._12_4_ == -0x80000000);
    auVar91._12_4_ = -(uint)(auVar83._12_4_ == -0x80000000);
    auVar91 = auVar91 & auVar108;
    auVar83 = pshuflw(auVar108,auVar91,0xe8);
    auVar83 = packssdw(auVar83,auVar83);
    bVar40 = auVar116[8];
    bVar41 = auVar116[9];
    bVar42 = auVar116[10];
    bVar43 = auVar116[0xb];
    bVar44 = auVar116[0xc];
    bVar45 = auVar116[0xd];
    bVar46 = auVar116[0xe];
    bVar47 = auVar116[0xf];
    uVar48 = (ushort)((ushort)bVar40 * 0x4f) >> 8;
    uVar60 = (ushort)((ushort)bVar41 * 0x4f) >> 8;
    uVar61 = (ushort)((ushort)bVar42 * 0x4f) >> 8;
    uVar64 = (ushort)((ushort)bVar43 * 0x4f) >> 8;
    uVar65 = (ushort)((ushort)bVar44 * 0x4f) >> 8;
    uVar68 = (ushort)((ushort)bVar45 * 0x4f) >> 8;
    uVar69 = (ushort)((ushort)bVar46 * 0x4f) >> 8;
    uVar71 = (ushort)((ushort)bVar47 * 0x4f) >> 8;
    cVar70 = auVar116[7];
    auVar2[0xd] = 0;
    auVar2._0_13_ = auVar116._0_13_;
    auVar2[0xe] = cVar70;
    cVar67 = auVar116[6];
    auVar4[0xc] = cVar67;
    auVar4._0_12_ = auVar116._0_12_;
    auVar4._13_2_ = auVar2._13_2_;
    auVar6[0xb] = 0;
    auVar6._0_11_ = auVar116._0_11_;
    auVar6._12_3_ = auVar4._12_3_;
    cVar66 = auVar116[5];
    auVar8[10] = cVar66;
    auVar8._0_10_ = auVar116._0_10_;
    auVar8._11_4_ = auVar6._11_4_;
    auVar10[9] = 0;
    auVar10._0_9_ = auVar116._0_9_;
    auVar10._10_5_ = auVar8._10_5_;
    cVar63 = auVar116[4];
    auVar12[8] = cVar63;
    auVar12._0_8_ = auVar116._0_8_;
    auVar12._9_6_ = auVar10._9_6_;
    auVar19._7_8_ = 0;
    auVar19._0_7_ = auVar12._8_7_;
    cVar62 = auVar116[3];
    Var16 = CONCAT81(SUB158(auVar19 << 0x40,7),cVar62);
    auVar23._9_6_ = 0;
    auVar23._0_9_ = Var16;
    cVar59 = auVar116[2];
    auVar20._1_10_ = SUB1510(auVar23 << 0x30,5);
    auVar20[0] = cVar59;
    auVar24._11_4_ = 0;
    auVar24._0_11_ = auVar20;
    cVar58 = auVar116[1];
    auVar14[2] = cVar58;
    auVar14._0_2_ = auVar116._0_2_;
    auVar14._3_12_ = SUB1512(auVar24 << 0x20,3);
    uVar72 = (auVar116._0_2_ & 0xff) * 0x4f;
    uVar74 = auVar14._2_2_ * 0x4f;
    uVar76 = auVar20._0_2_ * 0x4f;
    uVar78 = (short)Var16 * 0x4f;
    uVar148 = auVar12._8_2_ * 0x4f;
    uVar150 = auVar8._10_2_ * 0x4f;
    uVar153 = auVar4._12_2_ * 0x4f;
    uVar159 = (auVar2._13_2_ >> 8) * 0x4f;
    uVar73 = uVar72 >> 8;
    uVar75 = uVar74 >> 8;
    uVar77 = uVar76 >> 8;
    uVar142 = uVar78 >> 8;
    uVar149 = uVar148 >> 8;
    uVar151 = uVar150 >> 8;
    uVar156 = uVar153 >> 8;
    uVar138 = uVar159 >> 8;
    uVar72 = CONCAT11((uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75),
                      (uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar72 >> 8) - (0xff < uVar73));
    uVar32 = CONCAT13((uVar142 != 0) * (uVar142 < 0x100) * (char)(uVar78 >> 8) - (0xff < uVar142),
                      CONCAT12((uVar77 != 0) * (uVar77 < 0x100) * (char)(uVar76 >> 8) -
                               (0xff < uVar77),uVar72));
    uVar33 = CONCAT15((uVar151 != 0) * (uVar151 < 0x100) * (char)(uVar150 >> 8) - (0xff < uVar151),
                      CONCAT14((uVar149 != 0) * (uVar149 < 0x100) * (char)(uVar148 >> 8) -
                               (0xff < uVar149),uVar32));
    uVar34 = CONCAT17((uVar138 != 0) * (uVar138 < 0x100) * (char)(uVar159 >> 8) - (0xff < uVar138),
                      CONCAT16((uVar156 != 0) * (uVar156 < 0x100) * (char)(uVar153 >> 8) -
                               (0xff < uVar156),uVar33));
    auVar128._0_10_ =
         CONCAT19((uVar60 != 0) * (uVar60 < 0x100) * (char)((ushort)((ushort)bVar41 * 0x4f) >> 8) -
                  (0xff < uVar60),
                  CONCAT18((uVar48 != 0) * (uVar48 < 0x100) *
                           (char)((ushort)((ushort)bVar40 * 0x4f) >> 8) - (0xff < uVar48),uVar34));
    auVar128[10] = (uVar61 != 0) * (uVar61 < 0x100) * (char)((ushort)((ushort)bVar42 * 0x4f) >> 8) -
                   (0xff < uVar61);
    auVar128[0xb] =
         (uVar64 != 0) * (uVar64 < 0x100) * (char)((ushort)((ushort)bVar43 * 0x4f) >> 8) -
         (0xff < uVar64);
    auVar129[0xc] =
         (uVar65 != 0) * (uVar65 < 0x100) * (char)((ushort)((ushort)bVar44 * 0x4f) >> 8) -
         (0xff < uVar65);
    auVar129._0_12_ = auVar128;
    auVar129[0xd] =
         (uVar68 != 0) * (uVar68 < 0x100) * (char)((ushort)((ushort)bVar45 * 0x4f) >> 8) -
         (0xff < uVar68);
    auVar131[0xe] =
         (uVar69 != 0) * (uVar69 < 0x100) * (char)((ushort)((ushort)bVar46 * 0x4f) >> 8) -
         (0xff < uVar69);
    auVar131._0_14_ = auVar129;
    auVar131[0xf] =
         (uVar71 != 0) * (uVar71 < 0x100) * (char)((ushort)((ushort)bVar47 * 0x4f) >> 8) -
         (0xff < uVar71);
    auVar132._0_2_ = uVar72 >> 3;
    auVar132._2_2_ = (ushort)((uint)uVar32 >> 0x13);
    auVar132._4_2_ = (ushort)((uint6)uVar33 >> 0x23);
    auVar132._6_2_ = (ushort)((ulong)uVar34 >> 0x33);
    auVar132._8_2_ = (ushort)((unkuint10)auVar128._0_10_ >> 0x43);
    auVar132._10_2_ = auVar128._10_2_ >> 3;
    auVar132._12_2_ = auVar129._12_2_ >> 3;
    auVar132._14_2_ = auVar131._14_2_ >> 3;
    auVar132 = auVar132 & _DAT_002c53e0;
    sVar31 = CONCAT11(auVar132[8],auVar132[8]);
    uVar32 = CONCAT13(auVar132[9],CONCAT12(auVar132[9],sVar31));
    uVar33 = CONCAT15(auVar132[10],CONCAT14(auVar132[10],uVar32));
    uVar34 = CONCAT17(auVar132[0xb],CONCAT16(auVar132[0xb],uVar33));
    auVar35._0_10_ = CONCAT19(auVar132[0xc],CONCAT18(auVar132[0xc],uVar34));
    auVar35[10] = auVar132[0xd];
    auVar35[0xb] = auVar132[0xd];
    auVar36[0xc] = auVar132[0xe];
    auVar36._0_12_ = auVar35;
    auVar36[0xd] = auVar132[0xe];
    auVar37[0xf] = auVar132[0xf];
    auVar37[0xe] = auVar37[0xf];
    auVar37._0_14_ = auVar36;
    uVar48 = sVar31 * 0x1a;
    uVar61 = (short)((uint)uVar32 >> 0x10) * 0x1a;
    uVar65 = (short)((uint6)uVar33 >> 0x20) * 0x1a;
    uVar69 = (short)((ulong)uVar34 >> 0x30) * 0x1a;
    uVar72 = (short)((unkuint10)auVar35._0_10_ >> 0x40) * 0x1a;
    uVar74 = auVar35._10_2_ * 0x1a;
    uVar76 = auVar36._12_2_ * 0x1a;
    uVar78 = auVar37._14_2_ * 0x1a;
    uVar60 = uVar48 & 0xff;
    uVar64 = uVar61 & 0xff;
    uVar68 = uVar65 & 0xff;
    uVar71 = uVar69 & 0xff;
    uVar73 = uVar72 & 0xff;
    uVar75 = uVar74 & 0xff;
    uVar77 = uVar76 & 0xff;
    uVar142 = uVar78 & 0xff;
    auVar137._0_14_ = auVar132._0_14_;
    auVar137[0xe] = auVar132[7];
    auVar137[0xf] = auVar132[7];
    auVar136._14_2_ = auVar137._14_2_;
    auVar136._0_13_ = auVar132._0_13_;
    auVar136[0xd] = auVar132[6];
    auVar135._13_3_ = auVar136._13_3_;
    auVar135._0_12_ = auVar132._0_12_;
    auVar135[0xc] = auVar132[6];
    auVar134._12_4_ = auVar135._12_4_;
    auVar134._0_11_ = auVar132._0_11_;
    auVar134[0xb] = auVar132[5];
    auVar133._11_5_ = auVar134._11_5_;
    auVar133._0_10_ = auVar132._0_10_;
    auVar133[10] = auVar132[5];
    bVar152 = auVar132[0] * '\x1a';
    bVar154 = auVar132[1] * '\x1a';
    bVar155 = auVar132[2] * '\x1a';
    bVar157 = auVar132[3] * '\x1a';
    bVar158 = auVar132[4] * '\x1a';
    uVar156 = auVar133._10_2_ * 0x1a;
    uVar138 = auVar135._12_2_ * 0x1a;
    uVar148 = (ushort)bVar152;
    uVar149 = (ushort)bVar154;
    uVar150 = (ushort)bVar155;
    uVar151 = (ushort)bVar157;
    uVar153 = (ushort)bVar158;
    uVar159 = uVar156 & 0xff;
    uVar160 = uVar138 & 0xff;
    uVar139 = auVar136._14_2_ * 0x1a & 0xff;
    if ((auVar83 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      f99[lVar26 + 0x61] =
           (auVar116[0] - ((uVar148 != 0) * (uVar148 < 0x100) * bVar152 - (0xff < uVar148))) + 'A';
    }
    auVar83 = packssdw(auVar91,auVar91);
    auVar83 = packssdw(auVar83,auVar83);
    auVar83 = packsswb(auVar83,auVar83);
    if ((auVar83._0_4_ >> 8 & 1) != 0) {
      f99[lVar26 + 0x62] =
           (cVar58 - ((uVar149 != 0) * (uVar149 < 0x100) * bVar154 - (0xff < uVar149))) + 'A';
    }
    auVar83 = auVar118 ^ _DAT_00291150;
    auVar109._0_4_ = -(uint)(auVar83._0_4_ < -0x7fffff9c);
    auVar109._4_4_ = -(uint)(auVar83._0_4_ < -0x7fffff9c);
    auVar109._8_4_ = -(uint)(auVar83._8_4_ < -0x7fffff9c);
    auVar109._12_4_ = -(uint)(auVar83._8_4_ < -0x7fffff9c);
    auVar92._0_4_ = -(uint)(auVar83._4_4_ == -0x80000000);
    auVar92._4_4_ = -(uint)(auVar83._4_4_ == -0x80000000);
    auVar92._8_4_ = -(uint)(auVar83._12_4_ == -0x80000000);
    auVar92._12_4_ = -(uint)(auVar83._12_4_ == -0x80000000);
    auVar83 = packssdw(auVar83,auVar92 & auVar109);
    auVar83 = packssdw(auVar83,auVar83);
    auVar83 = packsswb(auVar83,auVar83);
    if ((auVar83._0_4_ >> 0x10 & 1) != 0) {
      f99[lVar26 + 99] =
           (cVar59 - ((uVar150 != 0) * (uVar150 < 0x100) * bVar155 - (0xff < uVar150))) + 'A';
    }
    auVar83 = pshufhw(auVar83,auVar92 & auVar109,0x84);
    auVar83 = packssdw(auVar83,auVar83);
    auVar83 = packsswb(auVar83,auVar83);
    if ((auVar83._0_4_ >> 0x18 & 1) != 0) {
      acStack_a4[lVar26] =
           (cVar62 - ((uVar151 != 0) * (uVar151 < 0x100) * bVar157 - (0xff < uVar151))) + 'A';
    }
    auVar83 = auVar125 ^ _DAT_00291150;
    auVar110._0_4_ = -(uint)(auVar83._0_4_ < -0x7fffff9c);
    auVar110._4_4_ = -(uint)(auVar83._0_4_ < -0x7fffff9c);
    auVar110._8_4_ = -(uint)(auVar83._8_4_ < -0x7fffff9c);
    auVar110._12_4_ = -(uint)(auVar83._8_4_ < -0x7fffff9c);
    auVar93._0_4_ = -(uint)(auVar83._4_4_ == -0x80000000);
    auVar93._4_4_ = -(uint)(auVar83._4_4_ == -0x80000000);
    auVar93._8_4_ = -(uint)(auVar83._12_4_ == -0x80000000);
    auVar93._12_4_ = -(uint)(auVar83._12_4_ == -0x80000000);
    auVar93 = auVar93 & auVar110;
    auVar83 = pshuflw(auVar83,auVar93,0xe8);
    auVar83 = packssdw(auVar83,auVar83);
    auVar83 = packsswb(auVar83,auVar83);
    if ((auVar83 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      acStack_a4[lVar26 + 1] =
           (cVar63 - ((uVar153 != 0) * (uVar153 < 0x100) * bVar158 - (0xff < uVar153))) + 'A';
    }
    auVar94 = packssdw(auVar93,auVar93);
    auVar83 = packssdw(auVar83,auVar94);
    auVar83 = packsswb(auVar83,auVar83);
    if ((auVar83._4_2_ >> 8 & 1) != 0) {
      acStack_a4[lVar26 + 2] =
           (cVar66 - ((uVar159 != 0) * (uVar159 < 0x100) * (char)uVar156 - (0xff < uVar159))) + 'A';
    }
    auVar83 = auVar79 ^ _DAT_00291150;
    auVar111._0_4_ = -(uint)(auVar83._0_4_ < -0x7fffff9c);
    auVar111._4_4_ = -(uint)(auVar83._0_4_ < -0x7fffff9c);
    auVar111._8_4_ = -(uint)(auVar83._8_4_ < -0x7fffff9c);
    auVar111._12_4_ = -(uint)(auVar83._8_4_ < -0x7fffff9c);
    auVar95._0_4_ = -(uint)(auVar83._4_4_ == -0x80000000);
    auVar95._4_4_ = -(uint)(auVar83._4_4_ == -0x80000000);
    auVar95._8_4_ = -(uint)(auVar83._12_4_ == -0x80000000);
    auVar95._12_4_ = -(uint)(auVar83._12_4_ == -0x80000000);
    auVar83 = packssdw(auVar83,auVar95 & auVar111);
    auVar83 = packssdw(auVar83,auVar83);
    auVar83 = packsswb(auVar83,auVar83);
    if ((auVar83 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      acStack_a4[lVar26 + 3] =
           (cVar67 - ((uVar160 != 0) * (uVar160 < 0x100) * (char)uVar138 - (0xff < uVar160))) + 'A';
    }
    auVar83 = pshufhw(auVar83,auVar95 & auVar111,0x84);
    auVar83 = packssdw(auVar83,auVar83);
    auVar83 = packsswb(auVar83,auVar83);
    if ((auVar83._6_2_ >> 8 & 1) != 0) {
      acStack_a4[lVar26 + 4] =
           (cVar70 - ((uVar139 != 0) * (uVar139 < 0x100) * (char)(auVar136._14_2_ * 0x1a) -
                     (0xff < uVar139))) + 'A';
    }
    auVar83 = auVar123 ^ _DAT_00291150;
    auVar112._0_4_ = -(uint)(auVar83._0_4_ < -0x7fffff9c);
    auVar112._4_4_ = -(uint)(auVar83._0_4_ < -0x7fffff9c);
    auVar112._8_4_ = -(uint)(auVar83._8_4_ < -0x7fffff9c);
    auVar112._12_4_ = -(uint)(auVar83._8_4_ < -0x7fffff9c);
    auVar96._0_4_ = -(uint)(auVar83._4_4_ == -0x80000000);
    auVar96._4_4_ = -(uint)(auVar83._4_4_ == -0x80000000);
    auVar96._8_4_ = -(uint)(auVar83._12_4_ == -0x80000000);
    auVar96._12_4_ = -(uint)(auVar83._12_4_ == -0x80000000);
    auVar96 = auVar96 & auVar112;
    auVar83 = pshuflw(auVar83,auVar96,0xe8);
    auVar83 = packssdw(auVar83,auVar83);
    auVar83 = packsswb(auVar83,auVar83);
    if ((auVar83 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      acStack_a4[lVar26 + 5] =
           (bVar40 - ((uVar60 != 0) * (uVar60 < 0x100) * (char)uVar48 - (0xff < uVar60))) + 'A';
    }
    auVar94 = packssdw(auVar96,auVar96);
    auVar94 = packssdw(auVar94,auVar94);
    auVar83 = packsswb(auVar83,auVar94);
    if ((auVar83._8_2_ >> 8 & 1) != 0) {
      acStack_a4[lVar26 + 6] =
           (bVar41 - ((uVar64 != 0) * (uVar64 < 0x100) * (char)uVar61 - (0xff < uVar64))) + 'A';
    }
    auVar83 = auVar121 ^ _DAT_00291150;
    auVar113._0_4_ = -(uint)(auVar83._0_4_ < -0x7fffff9c);
    auVar113._4_4_ = -(uint)(auVar83._0_4_ < -0x7fffff9c);
    auVar113._8_4_ = -(uint)(auVar83._8_4_ < -0x7fffff9c);
    auVar113._12_4_ = -(uint)(auVar83._8_4_ < -0x7fffff9c);
    auVar97._0_4_ = -(uint)(auVar83._4_4_ == -0x80000000);
    auVar97._4_4_ = -(uint)(auVar83._4_4_ == -0x80000000);
    auVar97._8_4_ = -(uint)(auVar83._12_4_ == -0x80000000);
    auVar97._12_4_ = -(uint)(auVar83._12_4_ == -0x80000000);
    auVar83 = packssdw(auVar83,auVar97 & auVar113);
    auVar83 = packssdw(auVar83,auVar83);
    auVar83 = packsswb(auVar83,auVar83);
    if ((auVar83 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      acStack_a4[lVar26 + 7] =
           (bVar42 - ((uVar68 != 0) * (uVar68 < 0x100) * (char)uVar65 - (0xff < uVar68))) + 'A';
    }
    auVar83 = pshufhw(auVar83,auVar97 & auVar113,0x84);
    auVar83 = packssdw(auVar83,auVar83);
    auVar83 = packsswb(auVar83,auVar83);
    if ((auVar83._10_2_ >> 8 & 1) != 0) {
      acStack_a4[lVar26 + 8] =
           (bVar43 - ((uVar71 != 0) * (uVar71 < 0x100) * (char)uVar69 - (0xff < uVar71))) + 'A';
    }
    auVar83 = auVar119 ^ _DAT_00291150;
    auVar114._0_4_ = -(uint)(auVar83._0_4_ < -0x7fffff9c);
    auVar114._4_4_ = -(uint)(auVar83._0_4_ < -0x7fffff9c);
    auVar114._8_4_ = -(uint)(auVar83._8_4_ < -0x7fffff9c);
    auVar114._12_4_ = -(uint)(auVar83._8_4_ < -0x7fffff9c);
    auVar98._0_4_ = -(uint)(auVar83._4_4_ == -0x80000000);
    auVar98._4_4_ = -(uint)(auVar83._4_4_ == -0x80000000);
    auVar98._8_4_ = -(uint)(auVar83._12_4_ == -0x80000000);
    auVar98._12_4_ = -(uint)(auVar83._12_4_ == -0x80000000);
    auVar98 = auVar98 & auVar114;
    auVar83 = pshuflw(auVar83,auVar98,0xe8);
    auVar83 = packssdw(auVar83,auVar83);
    auVar83 = packsswb(auVar83,auVar83);
    if ((auVar83 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      acStack_a4[lVar26 + 9] =
           (bVar44 - ((uVar73 != 0) * (uVar73 < 0x100) * (char)uVar72 - (0xff < uVar73))) + 'A';
    }
    auVar94 = packssdw(auVar98,auVar98);
    auVar83 = packssdw(auVar83,auVar94);
    auVar83 = packsswb(auVar83,auVar83);
    auVar38._8_8_ = lVar117;
    auVar38._0_8_ = lVar115;
    if ((auVar83._12_2_ >> 8 & 1) != 0) {
      acStack_a4[lVar26 + 10] =
           (bVar45 - ((uVar75 != 0) * (uVar75 < 0x100) * (char)uVar74 - (0xff < uVar75))) + 'A';
    }
    auVar38 = auVar38 ^ _DAT_00291150;
    auVar39._4_4_ = auVar38._4_4_;
    auVar39._12_4_ = auVar38._12_4_;
    auVar147._0_4_ = -(uint)(auVar38._0_4_ < -0x7fffff9c);
    auVar147._4_4_ = -(uint)(auVar38._0_4_ < -0x7fffff9c);
    auVar147._8_4_ = -(uint)(auVar38._8_4_ < -0x7fffff9c);
    auVar147._12_4_ = -(uint)(auVar38._8_4_ < -0x7fffff9c);
    auVar39._0_4_ = auVar39._4_4_;
    auVar39._8_4_ = auVar39._12_4_;
    auVar141._0_4_ = -(uint)(auVar39._4_4_ == -0x80000000);
    auVar141._4_4_ = -(uint)(auVar39._4_4_ == -0x80000000);
    auVar141._8_4_ = -(uint)(auVar39._12_4_ == -0x80000000);
    auVar141._12_4_ = -(uint)(auVar39._12_4_ == -0x80000000);
    auVar83 = packssdw(auVar39,auVar141 & auVar147);
    auVar83 = packssdw(auVar83,auVar83);
    auVar83 = packsswb(auVar83,auVar83);
    if ((auVar83 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      acStack_a4[lVar26 + 0xb] =
           (bVar46 - ((uVar77 != 0) * (uVar77 < 0x100) * (char)uVar76 - (0xff < uVar77))) + 'A';
    }
    auVar83 = pshufhw(auVar83,auVar141 & auVar147,0x84);
    auVar83 = packssdw(auVar83,auVar83);
    auVar83 = packsswb(auVar83,auVar83);
    if ((auVar83._14_2_ >> 8 & 1) != 0) {
      f100[lVar26] = (bVar47 - ((uVar142 != 0) * (uVar142 < 0x100) * (char)uVar78 - (0xff < uVar142)
                               )) + 'A';
    }
    lVar80 = auVar127._8_8_;
    auVar127._0_8_ = auVar127._0_8_ + 0x10;
    auVar127._8_8_ = lVar80 + 0x10;
    lVar80 = auVar118._8_8_;
    auVar118._0_8_ = auVar118._0_8_ + 0x10;
    auVar118._8_8_ = lVar80 + 0x10;
    lVar80 = auVar125._8_8_;
    auVar125._0_8_ = auVar125._0_8_ + 0x10;
    auVar125._8_8_ = lVar80 + 0x10;
    lVar80 = auVar79._8_8_;
    auVar79._0_8_ = auVar79._0_8_ + 0x10;
    auVar79._8_8_ = lVar80 + 0x10;
    lVar80 = auVar123._8_8_;
    auVar123._0_8_ = auVar123._0_8_ + 0x10;
    auVar123._8_8_ = lVar80 + 0x10;
    lVar80 = auVar121._8_8_;
    auVar121._0_8_ = auVar121._0_8_ + 0x10;
    auVar121._8_8_ = lVar80 + 0x10;
    lVar80 = auVar119._8_8_;
    auVar119._0_8_ = auVar119._0_8_ + 0x10;
    auVar119._8_8_ = lVar80 + 0x10;
    lVar115 = lVar115 + 0x10;
    lVar117 = lVar117 + 0x10;
    auVar116[0] = auVar116[0] + '\x10';
    auVar116[1] = cVar58 + '\x10';
    auVar116[2] = cVar59 + '\x10';
    auVar116[3] = cVar62 + '\x10';
    auVar116[4] = cVar63 + '\x10';
    auVar116[5] = cVar66 + '\x10';
    auVar116[6] = cVar67 + '\x10';
    auVar116[7] = cVar70 + '\x10';
    auVar116[8] = bVar40 + 0x10;
    auVar116[9] = bVar41 + 0x10;
    auVar116[10] = bVar42 + 0x10;
    auVar116[0xb] = bVar43 + 0x10;
    auVar116[0xc] = bVar44 + 0x10;
    auVar116[0xd] = bVar45 + 0x10;
    auVar116[0xe] = bVar46 + 0x10;
    auVar116[0xf] = bVar47 + 0x10;
    lVar26 = lVar26 + 0x10;
  } while (lVar26 != 0x7f);
  wVar29 = L'\0';
  f100[100] = '\0';
  buff = (undefined4 *)malloc(100000);
  _a = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'H',(uint)(_a != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar25 = archive_write_set_format_v7tar(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'J',0,"ARCHIVE_OK",(long)iVar25,"archive_write_set_format_v7tar(a)",_a);
  iVar25 = archive_write_add_filter_none(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'L',0,"ARCHIVE_OK",(long)iVar25,"archive_write_add_filter_none(a)",_a);
  iVar25 = archive_write_open_memory(_a,buff,100000,&used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'N',0,"ARCHIVE_OK",(long)iVar25,
                      "archive_write_open_memory(a, buff, buffsize, &used)",_a);
  paVar27 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'V',(uint)(paVar27 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar27,1,10);
  archive_entry_set_pathname(paVar27,"file");
  archive_entry_set_mode(paVar27,0x81b4);
  archive_entry_set_size(paVar27,10);
  archive_entry_set_uid(paVar27,0x50);
  archive_entry_set_gid(paVar27,0x5a);
  archive_entry_set_dev(paVar27,0xc);
  archive_entry_set_ino(paVar27,0x59);
  archive_entry_set_nlink(paVar27,2);
  iVar25 = archive_write_header(_a,paVar27);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'`',0,"ARCHIVE_OK",(long)iVar25,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar27);
  lVar28 = archive_write_data(_a,"1234567890",10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'b',10,"10",lVar28,"archive_write_data(a, \"1234567890\", 10)",_a);
  paVar27 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'e',(uint)(paVar27 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar27,1,10);
  archive_entry_set_pathname(paVar27,"linkfile");
  archive_entry_set_hardlink(paVar27,"file");
  archive_entry_set_mode(paVar27,0x81b4);
  archive_entry_set_size(paVar27,10);
  archive_entry_set_uid(paVar27,0x50);
  archive_entry_set_gid(paVar27,0x5a);
  archive_entry_set_dev(paVar27,0xc);
  archive_entry_set_ino(paVar27,0x59);
  archive_entry_set_nlink(paVar27,2);
  iVar25 = archive_write_header(_a,paVar27);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'p',0,"ARCHIVE_OK",(long)iVar25,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar27);
  lVar28 = archive_write_data(_a,"1234567890",10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L's',0,"0",lVar28,"archive_write_data(a, \"1234567890\", 10)",_a);
  paVar27 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'v',(uint)(paVar27 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar27,2,0x14);
  archive_entry_set_pathname(paVar27,"dir");
  archive_entry_set_mode(paVar27,0x41fd);
  archive_entry_set_size(paVar27,10);
  archive_entry_set_nlink(paVar27,2);
  iVar25 = archive_write_header(_a,paVar27);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'|',0,"ARCHIVE_OK",(long)iVar25,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar27);
  lVar28 = archive_write_data(_a,"1234567890",10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'\x7f',0,"0",lVar28,"archive_write_data(a, \"1234567890\", 10)",_a);
  paVar27 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'\x82',(uint)(paVar27 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar27,3,0x1e);
  archive_entry_set_pathname(paVar27,"symlink");
  archive_entry_set_mode(paVar27,0x1b4);
  archive_entry_set_filetype(paVar27,0xa000);
  archive_entry_set_symlink(paVar27,"file");
  archive_entry_set_size(paVar27,0);
  archive_entry_set_uid(paVar27,0x58);
  archive_entry_set_gid(paVar27,0x62);
  archive_entry_set_dev(paVar27,0xc);
  archive_entry_set_ino(paVar27,0x5a);
  archive_entry_set_nlink(paVar27,1);
  iVar25 = archive_write_header(_a,paVar27);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'\x8e',0,"ARCHIVE_OK",(long)iVar25,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar27);
  paVar27 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'\x92',(uint)(paVar27 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar27,1,10);
  archive_entry_set_pathname(paVar27,f99);
  archive_entry_set_mode(paVar27,0x81b4);
  archive_entry_set_size(paVar27,0);
  archive_entry_set_uid(paVar27,0x52);
  archive_entry_set_gid(paVar27,0x5d);
  archive_entry_set_dev(paVar27,0x66);
  archive_entry_set_ino(paVar27,7);
  archive_entry_set_nlink(paVar27,1);
  iVar25 = archive_write_header(_a,paVar27);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'\x9c',0,"ARCHIVE_OK",(long)iVar25,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar27);
  paVar27 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'\xa0',(uint)(paVar27 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar27,1,10);
  archive_entry_set_pathname(paVar27,f100);
  archive_entry_set_mode(paVar27,0x81b4);
  archive_entry_set_size(paVar27,0);
  archive_entry_set_uid(paVar27,0x52);
  archive_entry_set_gid(paVar27,0x5d);
  archive_entry_set_dev(paVar27,0x66);
  archive_entry_set_ino(paVar27,7);
  archive_entry_set_nlink(paVar27,1);
  failure("100-char filename should be rejected");
  iVar25 = archive_write_header(_a,paVar27);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'«',-0x19,"ARCHIVE_FAILED",(long)iVar25,"archive_write_header(a, entry)",_a
                     );
  archive_entry_free(paVar27);
  iVar25 = archive_write_free(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'¯',0,"ARCHIVE_OK",(long)iVar25,"archive_write_free(a)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'·',buff,"e + 0","file","\"file\"",5,"5",(void *)0x0);
  *buff = 0;
  *(undefined1 *)(buff + 1) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'¸',buff + 0x19,"e + 100","000664 ","\"000664 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x19) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'¹',buff + 0x1b,"e + 108","000120 ","\"000120 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x1b) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'º',buff + 0x1d,"e + 116","000132 ","\"000132 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x1d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'»',buff + 0x1f,"e + 124","00000000012 ","\"00000000012 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x1f) = 0;
  buff[0x21] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'¼',buff + 0x22,"e + 136","00000000001 ","\"00000000001 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x22) = 0;
  buff[0x24] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'½',buff + 0x25,"e + 148","005335","\"005335\\0 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x25) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'¾',buff + 0x27,"e + 156","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)(buff + 0x27) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'¿',(void *)((long)buff + 0x9d),"e + 157","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x9d) = 0;
  lVar26 = 0;
  do {
    if (*(char *)((long)buff + lVar26) != '\0') goto LAB_0020446f;
    lVar26 = lVar26 + 1;
  } while (lVar26 != 0x200);
  wVar29 = L'\x01';
LAB_0020446f:
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'À',wVar29,"is_null(e + 0, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Á',buff + 0x80,"e + 512","1234567890","\"1234567890\"",10,"10",(void *)0x0
                     );
  *(undefined8 *)(buff + 0x80) = 0;
  *(undefined2 *)(buff + 0x82) = 0;
  lVar26 = 0x201;
  do {
    if (lVar26 == 0x400) {
      wVar29 = L'\x01';
      goto LAB_00204500;
    }
    pcVar1 = (char *)((long)buff + lVar26);
    lVar26 = lVar26 + 1;
  } while (*pcVar1 == '\0');
  wVar29 = L'\0';
LAB_00204500:
  wVar30 = L'\0';
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'Â',wVar29,"is_null(e + 512, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Æ',buff + 0x100,"e + 0","linkfile","\"linkfile\"",9,"9",(void *)0x0);
  *(undefined8 *)(buff + 0x100) = 0;
  *(undefined1 *)(buff + 0x102) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Ç',buff + 0x119,"e + 100","000664 ","\"000664 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x119) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'È',buff + 0x11b,"e + 108","000120 ","\"000120 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x11b) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'É',buff + 0x11d,"e + 116","000132 ","\"000132 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x11d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Ê',buff + 0x11f,"e + 124","00000000000 ","\"00000000000 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x11f) = 0;
  buff[0x121] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Ë',buff + 0x122,"e + 136","00000000001 ","\"00000000001 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x122) = 0;
  buff[0x124] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Ì',buff + 0x125,"e + 148","007131","\"007131\\0 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x125) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Í',buff + 0x127,"e + 156","1","\"1\"",1,"1",(void *)0x0);
  *(undefined1 *)(buff + 0x127) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Î',(void *)((long)buff + 0x49d),"e + 157","file","\"file\"",5,"5",
                      (void *)0x0);
  *(undefined4 *)((long)buff + 0x49d) = 0;
  *(undefined1 *)((long)buff + 0x4a1) = 0;
  lVar26 = -0x200;
  do {
    if (*(char *)((long)buff + lVar26 + 0x600) != '\0') goto LAB_002047b7;
    lVar26 = lVar26 + 1;
  } while (lVar26 != 0);
  wVar30 = L'\x01';
LAB_002047b7:
  wVar29 = L'\0';
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'Ï',wVar30,"is_null(e + 0, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Ó',buff + 0x180,"e + 0","dir/","\"dir/\"",4,"4",(void *)0x0);
  buff[0x180] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Ô',buff + 0x199,"e + 100","000775 ","\"000775 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x199) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Õ',buff + 0x19b,"e + 108","000000 ","\"000000 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x19b) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Ö',buff + 0x19d,"e + 116","000000 ","\"000000 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x19d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'×',buff + 0x19f,"e + 124","00000000000 ","\"00000000000 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x19f) = 0;
  buff[0x1a1] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Ø',buff + 0x1a2,"e + 136","00000000002 ","\"00000000002 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x1a2) = 0;
  buff[0x1a4] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Ù',buff + 0x1a5,"e + 148","005243","\"005243\\0 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x1a5) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Ú',buff + 0x1a7,"e + 156","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)(buff + 0x1a7) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Û',(void *)((long)buff + 0x69d),"e + 157","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x69d) = 0;
  lVar26 = 0x600;
  do {
    if (*(char *)((long)buff + lVar26) != '\0') goto LAB_00204a68;
    lVar26 = lVar26 + 1;
  } while (lVar26 != 0x800);
  wVar29 = L'\x01';
LAB_00204a68:
  wVar30 = L'\0';
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'Ü',wVar29,"is_null(e + 0, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'à',buff + 0x200,"e + 0","symlink","\"symlink\"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x200) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'á',buff + 0x219,"e + 100","000664 ","\"000664 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x219) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'â',buff + 0x21b,"e + 108","000130 ","\"000130 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x21b) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'ã',buff + 0x21d,"e + 116","000142 ","\"000142 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x21d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'ä',buff + 0x21f,"e + 124","00000000000 ","\"00000000000 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x21f) = 0;
  buff[0x221] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'å',buff + 0x222,"e + 136","00000000003 ","\"00000000003 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x222) = 0;
  buff[0x224] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'æ',buff + 0x225,"e + 148","007027","\"007027\\0 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x225) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'ç',buff + 0x227,"e + 156","2","\"2\"",1,"1",(void *)0x0);
  *(undefined1 *)(buff + 0x227) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'è',(void *)((long)buff + 0x89d),"e + 157","file","\"file\"",5,"5",
                      (void *)0x0);
  *(undefined4 *)((long)buff + 0x89d) = 0;
  *(undefined1 *)((long)buff + 0x8a1) = 0;
  lVar26 = -0x200;
  do {
    if (*(char *)((long)buff + lVar26 + 0xa00) != '\0') goto LAB_00204d20;
    lVar26 = lVar26 + 1;
  } while (lVar26 != 0);
  wVar30 = L'\x01';
LAB_00204d20:
  wVar29 = L'\0';
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'é',wVar30,"is_null(e + 0, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'í',buff + 0x280,"e + 0",f99,"f99",100,"100",(void *)0x0);
  *(undefined1 (*) [16])(buff + 0x280) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(buff + 0x284) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(buff + 0x288) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(buff + 0x28c) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(buff + 0x290) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(buff + 0x294) = (undefined1  [16])0x0;
  buff[0x298] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'î',buff + 0x299,"e + 100","000664 ","\"000664 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x299) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'ï',buff + 0x29b,"e + 108","000122 ","\"000122 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x29b) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'ð',buff + 0x29d,"e + 116","000135 ","\"000135 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x29d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'ñ',buff + 0x29f,"e + 124","00000000000 ","\"00000000000 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x29f) = 0;
  buff[0x2a1] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'ò',buff + 0x2a2,"e + 136","00000000001 ","\"00000000001 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x2a2) = 0;
  buff[0x2a4] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'ó',buff + 0x2a5,"e + 148","031543","\"031543\\0 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x2a5) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'ô',buff + 0x2a7,"e + 156","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)(buff + 0x2a7) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'õ',(void *)((long)buff + 0xa9d),"e + 157","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0xa9d) = 0;
  lVar26 = -0x200;
  do {
    if (*(char *)((long)buff + lVar26 + 0xc00) != '\0') goto LAB_0020500a;
    lVar26 = lVar26 + 1;
  } while (lVar26 != 0);
  wVar29 = L'\x01';
LAB_0020500a:
  wVar30 = L'\0';
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'ö',wVar29,"is_null(e + 0, 512)",(void *)0x0);
  lVar26 = 0xc00;
  do {
    if (*(char *)((long)buff + lVar26) != '\0') goto LAB_00205047;
    lVar26 = lVar26 + 1;
  } while (lVar26 != 0x1000);
  wVar30 = L'\x01';
LAB_00205047:
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'ü',wVar30,"is_null(e, 1024)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'ÿ',(long)(int)used,"(int)used",0x1000,"e - buff",(void *)0x0);
  free(buff);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_tar_v7tar)
{
	struct archive *a;
	struct archive_entry *entry;
	char *buff, *e;
	size_t buffsize = 100000;
	size_t used;
	int i;
	char f99[100];
	char f100[101];

	for (i = 0; i < 99; ++i)
		f99[i] = 'a' + i % 26;
	f99[99] = '\0';

	for (i = 0; i < 100; ++i)
		f100[i] = 'A' + i % 26;
	f100[100] = '\0';

	buff = malloc(buffsize);

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_format_v7tar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used));

	/*
	 * Add various files to it.
	 * TODO: Extend this to cover more filetypes.
	 */

	/* "file" with 10 bytes of content */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 1, 10);
	archive_entry_set_pathname(entry, "file");
	archive_entry_set_mode(entry, S_IFREG | 0664);
	archive_entry_set_size(entry, 10);
	archive_entry_set_uid(entry, 80);
	archive_entry_set_gid(entry, 90);
	archive_entry_set_dev(entry, 12);
	archive_entry_set_ino(entry, 89);
	archive_entry_set_nlink(entry, 2);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, entry));
	archive_entry_free(entry);
	assertEqualIntA(a, 10, archive_write_data(a, "1234567890", 10));

	/* Hardlink to "file" with 10 bytes of content */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 1, 10);
	archive_entry_set_pathname(entry, "linkfile");
	archive_entry_set_hardlink(entry, "file");
	archive_entry_set_mode(entry, S_IFREG | 0664);
	archive_entry_set_size(entry, 10);
	archive_entry_set_uid(entry, 80);
	archive_entry_set_gid(entry, 90);
	archive_entry_set_dev(entry, 12);
	archive_entry_set_ino(entry, 89);
	archive_entry_set_nlink(entry, 2);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, entry));
	archive_entry_free(entry);
	/* Write of data to dir should fail == zero bytes get written. */
	assertEqualIntA(a, 0, archive_write_data(a, "1234567890", 10));

	/* "dir" */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 2, 20);
	archive_entry_set_pathname(entry, "dir");
	archive_entry_set_mode(entry, S_IFDIR | 0775);
	archive_entry_set_size(entry, 10);
	archive_entry_set_nlink(entry, 2);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, entry));
	archive_entry_free(entry);
	/* Write of data to dir should fail == zero bytes get written. */
	assertEqualIntA(a, 0, archive_write_data(a, "1234567890", 10));

	/* "symlink" pointing to "file" */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 3, 30);
	archive_entry_set_pathname(entry, "symlink");
	archive_entry_set_mode(entry, 0664);
	archive_entry_set_filetype(entry, AE_IFLNK);
	archive_entry_set_symlink(entry,"file");
	archive_entry_set_size(entry, 0);
	archive_entry_set_uid(entry, 88);
	archive_entry_set_gid(entry, 98);
	archive_entry_set_dev(entry, 12);
	archive_entry_set_ino(entry, 90);
	archive_entry_set_nlink(entry, 1);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, entry));
	archive_entry_free(entry);

	/* file with 99-char filename. */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 1, 10);
	archive_entry_set_pathname(entry, f99);
	archive_entry_set_mode(entry, S_IFREG | 0664);
	archive_entry_set_size(entry, 0);
	archive_entry_set_uid(entry, 82);
	archive_entry_set_gid(entry, 93);
	archive_entry_set_dev(entry, 102);
	archive_entry_set_ino(entry, 7);
	archive_entry_set_nlink(entry, 1);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, entry));
	archive_entry_free(entry);

	/* file with 100-char filename. */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 1, 10);
	archive_entry_set_pathname(entry, f100);
	archive_entry_set_mode(entry, S_IFREG | 0664);
	archive_entry_set_size(entry, 0);
	archive_entry_set_uid(entry, 82);
	archive_entry_set_gid(entry, 93);
	archive_entry_set_dev(entry, 102);
	archive_entry_set_ino(entry, 7);
	archive_entry_set_nlink(entry, 1);
	failure("100-char filename should be rejected");
	assertEqualIntA(a, ARCHIVE_FAILED, archive_write_header(a, entry));
	archive_entry_free(entry);

	/* Close out the archive. */
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Verify the archive format.
	 */
	e = buff;

	/* "file" */
	myAssertEqualMem(e + 0, "file", 5); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000120 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000132 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000012 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000001 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "005335\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "", 1); /* linkflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	assert(is_null(e + 0, 512));
	myAssertEqualMem(e + 512, "1234567890", 10);
	assert(is_null(e + 512, 512));
	e += 1024;

	/* hardlink to "file" */
	myAssertEqualMem(e + 0, "linkfile", 9); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000120 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000132 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000001 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "007131\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "1", 1); /* linkflag */
	myAssertEqualMem(e + 157, "file", 5); /* linkname */
	assert(is_null(e + 0, 512));
	e += 512;

	/* "dir" */
	myAssertEqualMem(e + 0, "dir/", 4); /* Filename */
	myAssertEqualMem(e + 100, "000775 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000000 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000000 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000002 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "005243\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "", 1); /* typeflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	assert(is_null(e + 0, 512));
	e += 512;

	/* "symlink" pointing to "file" */
	myAssertEqualMem(e + 0, "symlink", 8); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000130 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000142 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000003 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "007027\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "2", 1); /* linkflag */
	myAssertEqualMem(e + 157, "file", 5); /* linkname */
	assert(is_null(e + 0, 512));
	e += 512;

	/* File with 99-char filename */
	myAssertEqualMem(e + 0, f99, 100); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000122 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000135 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000001 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "031543\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "", 1); /* linkflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	assert(is_null(e + 0, 512));
	e += 512;

	/* TODO: Verify other types of entries. */

	/* Last entry is end-of-archive marker. */
	assert(is_null(e, 1024));
	e += 1024;

	assertEqualInt((int)used, e - buff);

	free(buff);
}